

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

Node * __thiscall
SQCompilation::NameShadowingChecker::extractPointedNode(NameShadowingChecker *this,SymbolInfo *info)

{
  SymbolInfo *info_local;
  NameShadowingChecker *this_local;
  Id *local_8;
  
  switch(info->kind) {
  case SK_EXCEPTION:
    local_8 = (info->declaration).x;
    break;
  case SK_FUNCTION:
    local_8 = (info->declaration).x;
    break;
  case SK_CLASS:
    local_8 = (info->declaration).x;
    break;
  case SK_TABLE:
    local_8 = (info->declaration).x;
    break;
  case SK_VAR:
  case SK_BINDING:
  case SK_FOREACH:
    local_8 = (info->declaration).x;
    break;
  case SK_CONST:
    local_8 = (info->declaration).x;
    break;
  case SK_ENUM:
    local_8 = (info->declaration).x;
    break;
  case SK_ENUM_CONST:
    local_8 = (Id *)((info->declaration).ec)->val;
    break;
  case SK_PARAM:
    local_8 = (info->declaration).x;
    break;
  case SK_EXTERNAL_BINDING:
    local_8 = &this->rootPointerNode;
    break;
  default:
    local_8 = (Id *)0x0;
  }
  return (Node *)local_8;
}

Assistant:

const Node *NameShadowingChecker::extractPointedNode(const SymbolInfo *info) {
  switch (info->kind)
  {
  case SK_EXCEPTION:
    return info->declaration.x;
  case SK_FUNCTION:
    return info->declaration.f;
  case SK_CLASS:
    return info->declaration.k;
  case SK_TABLE:
    return info->declaration.t;
  case SK_VAR:
  case SK_BINDING:
  case SK_FOREACH:
    return info->declaration.v;
  case SK_CONST:
    return info->declaration.c;
  case SK_ENUM:
    return info->declaration.e;
  case SK_ENUM_CONST:
    return info->declaration.ec->val;
  case SK_PARAM:
    return info->declaration.p;
  case SK_EXTERNAL_BINDING:
    return &rootPointerNode;
  default:
    assert(0);
    return nullptr;
  }
}